

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _i,bool lhsFixed,DataArray<bool> *fixCols,
          Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lo,Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *up,shared_ptr<soplex::Tolerances> *tols)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  Item *pIVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  undefined **local_88;
  undefined **local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_78 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_80 = &PTR__PostStep_003b5810;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b5810;
  (this->super_PostStep).m_name = "ForceConstraint";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_70);
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__ForceConstraintPS_003b5b90;
  this->m_i = _i;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  pVVar11 = &(lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right;
  if (lhsFixed) {
    pVVar11 = &(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left;
  }
  pnVar4 = (pVVar11->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar4[_i].m_backend.data + 0x20);
  uVar7 = *(undefined8 *)&pnVar4[_i].m_backend.data;
  uVar8 = *(undefined8 *)((long)&pnVar4[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[_i].m_backend.data + 0x10);
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2) = uVar8;
  (this->m_lRhs).m_backend.exp = pnVar4[_i].m_backend.exp;
  (this->m_lRhs).m_backend.neg = pnVar4[_i].m_backend.neg;
  iVar10 = pnVar4[_i].m_backend.prec_elem;
  (this->m_lRhs).m_backend.fpclass = pnVar4[_i].m_backend.fpclass;
  (this->m_lRhs).m_backend.prec_elem = iVar10;
  pIVar5 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_i].idx;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  local_88 = &PTR__DSVectorBase_003b4310;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b4310;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             pIVar5[iVar2].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar5 + iVar2));
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array(&this->m_objs,
          (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[_i].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused);
  local_90 = &this->m_objs;
  DataArray<bool>::DataArray(&this->m_fixed,fixCols);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_cols,
          (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[_i].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused);
  this->m_lhsFixed = lhsFixed;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array(&this->m_oldLowers,lo);
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array(&this->m_oldUppers,up);
  pnVar4 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar4[_i].m_backend.data + 0x20);
  uVar7 = *(undefined8 *)&pnVar4[_i].m_backend.data;
  uVar8 = *(undefined8 *)((long)&pnVar4[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[_i].m_backend.data + 0x10);
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_lhs).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2) = uVar8;
  (this->m_lhs).m_backend.exp = pnVar4[_i].m_backend.exp;
  (this->m_lhs).m_backend.neg = pnVar4[_i].m_backend.neg;
  iVar10 = pnVar4[_i].m_backend.prec_elem;
  (this->m_lhs).m_backend.fpclass = pnVar4[_i].m_backend.fpclass;
  (this->m_lhs).m_backend.prec_elem = iVar10;
  pnVar4 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar4[_i].m_backend.data + 0x20);
  uVar7 = *(undefined8 *)&pnVar4[_i].m_backend.data;
  uVar8 = *(undefined8 *)((long)&pnVar4[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[_i].m_backend.data + 0x10);
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_rhs).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2) = uVar8;
  (this->m_rhs).m_backend.exp = pnVar4[_i].m_backend.exp;
  (this->m_rhs).m_backend.neg = pnVar4[_i].m_backend.neg;
  iVar10 = pnVar4[_i].m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = pnVar4[_i].m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar10;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::rowObj(&this->m_rowobj,lp,_i);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar15 = 0x38;
    lVar14 = 0x30;
    lVar12 = 0;
    lVar13 = 0;
    do {
      iVar2 = *(int *)((long)(((this->m_row).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar15);
      if (lp->thesense == MINIMIZE) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::obj(&local_c8,lp,iVar2);
      }
      else {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::obj(&local_68,lp,iVar2);
        local_c8.m_backend.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
        local_c8.m_backend.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
        uVar7 = local_c8.m_backend.data._M_elems._0_8_;
        local_c8.m_backend.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
        local_c8.m_backend.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
        local_c8.m_backend.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
        local_c8.m_backend.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
        local_c8.m_backend.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
        local_c8.m_backend.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
        local_c8.m_backend.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
        local_c8.m_backend.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
        local_c8.m_backend.exp = local_68.m_backend.exp;
        local_c8.m_backend.neg = local_68.m_backend.neg;
        local_c8.m_backend.fpclass = local_68.m_backend.fpclass;
        local_c8.m_backend.prec_elem = local_68.m_backend.prec_elem;
        local_c8.m_backend.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
        bVar6 = local_c8.m_backend.data._M_elems[0] != 0;
        local_c8.m_backend.data._M_elems._0_8_ = uVar7;
        if (local_68.m_backend.fpclass != cpp_dec_float_finite || bVar6) {
          local_c8.m_backend.neg = (bool)(local_68.m_backend.neg ^ 1);
        }
      }
      pnVar4 = (this->m_objs).data.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar14 + -0x10) =
           local_c8.m_backend.data._M_elems._32_8_;
      puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar14 + -0x20);
      *(undefined8 *)puVar1 = local_c8.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_c8.m_backend.data._M_elems._24_8_;
      puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar14 + -0x30);
      *(undefined8 *)puVar1 = local_c8.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(puVar1 + 2) = local_c8.m_backend.data._M_elems._8_8_;
      *(int *)((long)&(pnVar4->m_backend).data + lVar14 + -8) = local_c8.m_backend.exp;
      *(bool *)((long)&(pnVar4->m_backend).data + lVar14 + -4) = local_c8.m_backend.neg;
      *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar14) = local_c8.m_backend._48_8_;
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)((long)&((this->m_cols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase +
                     lVar12),
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem +
                     (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey
                     [*(int *)((long)(((this->m_row).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val).m_backend.data._M_elems + lVar15)].idx));
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x3c;
      lVar12 = lVar12 + 0x20;
      lVar14 = lVar14 + 0x38;
    } while (lVar13 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return;
}

Assistant:

ForceConstraintPS(const SPxLPBase<R>& lp, int _i, bool lhsFixed,
                        DataArray<bool>& fixCols,
                        Array<R>& lo, Array<R>& up, std::shared_ptr<Tolerances> tols)
         : PostStep("ForceConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_lRhs(lhsFixed ? lp.lhs(_i) : lp.rhs(_i))
         , m_row(lp.rowVector(_i))
         , m_objs(lp.rowVector(_i).size())
         , m_fixed(fixCols)
         , m_cols(lp.rowVector(_i).size())
         , m_lhsFixed(lhsFixed)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_oldLowers(lo)
         , m_oldUppers(up)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_rowobj(lp.rowObj(_i))
      {
         for(int k = 0; k < m_row.size(); ++k)
         {
            m_objs[k] = (lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(m_row.index(k)) : -lp.obj(m_row.index(
                            k)));
            m_cols[k] = lp.colVector(m_row.index(k));
         }
      }